

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

tc_toktyp_t __thiscall
CTcTokenizer::xlat_string_to
          (CTcTokenizer *this,char *dstp,utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,
          int force_embed_end)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  uint ch;
  wchar_t qu;
  tc_toktyp_t tVar4;
  int iVar5;
  wchar_t wVar6;
  int iVar7;
  wchar_t wVar8;
  size_t sVar9;
  utf8_ptr uVar10;
  long lVar11;
  uint uVar12;
  tc_toktyp_t tVar13;
  tok_embed_level *ptVar14;
  byte *pbVar15;
  byte *pbVar16;
  CTcTokenizer *pCVar17;
  CTcTokenizer *pCVar18;
  ulong uVar19;
  uint uVar20;
  utf8_ptr fmt;
  utf8_ptr dst;
  CTcToken ftok;
  utf8_ptr local_88;
  tok_embed_ctx *local_80;
  byte *local_78;
  CTcTokenizer *local_70;
  utf8_ptr local_68;
  utf8_ptr local_60;
  CTcToken local_58;
  
  local_88.p_ = dstp;
  qu = utf8_ptr::s_getch(p->p_);
  if (qu == L'\"') {
    tVar4 = TOKT_DSTR;
LAB_0021a84d:
    tok->typ_ = tVar4;
  }
  else {
    if (qu == L'\'') {
      tVar4 = TOKT_SSTR;
      goto LAB_0021a84d;
    }
    if (qu != L'R') {
      tVar4 = TOKT_INVALID;
      if ((ec != (tok_embed_ctx *)0x0) && (ec->level != 0)) {
        tVar4 = ec->s->endtok;
      }
      goto LAB_0021a84d;
    }
    tok->typ_ = TOKT_RESTR;
    bVar1 = *p->p_;
    pbVar16 = (byte *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
    p->p_ = (char *)pbVar16;
    qu = utf8_ptr::s_getch((char *)pbVar16);
  }
  local_78 = (byte *)dstp;
  local_80 = ec;
  if ((qu == L'\"') || (qu == L'\'')) {
    iVar5 = count_quotes((utf8_ptr *)p->p_,qu);
    iVar7 = 0;
    pbVar16 = (byte *)p->p_;
    if (2 < iVar5) {
      uVar19 = (ulong)(((*pbVar16 >> 5 & 1) != 0) + 1 & (uint)(*pbVar16 >> 7) * 3);
      p->p_ = (char *)(pbVar16 + uVar19 + 1);
      bVar1 = pbVar16[uVar19 + 1];
      pbVar16 = pbVar16 + (((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + uVar19 + 2;
      p->p_ = (char *)pbVar16;
      iVar7 = 1;
    }
  }
  else {
    pbVar16 = (byte *)p->p_;
    iVar7 = 0;
  }
  iVar5 = 0;
  uVar19 = (ulong)(((*pbVar16 >> 5 & 1) != 0) + 1 & (uint)(*pbVar16 >> 7) * 3);
  pbVar15 = pbVar16 + uVar19 + 1;
  p->p_ = (char *)pbVar15;
  if (force_embed_end == 0) {
    iVar5 = iVar7;
    if ((qu != L'>') || ((local_80->level != 0 && (qu = L'>', local_80->s->parens != 0))))
    goto LAB_0021aa02;
    iVar5 = 0;
    p->p_ = (char *)(pbVar15 +
                    (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3) + 1);
    uVar20 = local_80->level;
    if (uVar20 != 0) {
      qu = local_80->s->qu;
      iVar5 = local_80->s->triple;
      uVar12 = uVar20;
      if (0 < (int)uVar20) {
        uVar12 = uVar20 - 1;
        local_80->level = uVar12;
        if (uVar12 == 0) goto LAB_0021a9f9;
        if (10 < uVar20) goto LAB_0021aa02;
      }
      goto LAB_0021a978;
    }
    ptVar14 = (tok_embed_level *)0x0;
    qu = L'\0';
  }
  else {
    pbVar16 = pbVar16 + uVar19;
    bVar1 = pbVar16[-(ulong)(~(uint)(*pbVar16 >> 6) & (uint)(*pbVar16 >> 7))];
    p->p_ = (char *)(pbVar16 + -(ulong)(~(uint)(*pbVar16 >> 6) & (uint)(*pbVar16 >> 7)) +
                    -(ulong)(~(uint)(bVar1 >> 6) & (uint)(bVar1 >> 7)));
    qu = L'\0';
    tVar4 = TOKT_INVALID;
    if (local_80->level != 0) {
      ptVar14 = local_80->s;
      tVar4 = ptVar14->endtok;
      qu = ptVar14->qu;
      iVar5 = ptVar14->triple;
    }
    tok->typ_ = tVar4;
    uVar12 = local_80->level;
    if (0 < (int)uVar12) {
      uVar12 = uVar12 - 1;
      local_80->level = uVar12;
    }
    if (uVar12 == 0) {
LAB_0021a9f9:
      ptVar14 = (tok_embed_level *)0x0;
    }
    else {
      if (9 < (int)uVar12) goto LAB_0021aa02;
LAB_0021a978:
      ptVar14 = local_80->stk + (long)(int)uVar12 + -1;
    }
  }
  local_80->s = ptVar14;
LAB_0021aa02:
  local_70 = this;
  while( true ) {
    while( true ) {
      pCVar17 = (CTcTokenizer *)p->p_;
      wVar6 = utf8_ptr::s_getch((char *)pCVar17);
      if (wVar6 == qu) {
        pCVar17 = (CTcTokenizer *)p->p_;
        if (iVar5 == 0) {
          p->p_ = &pCVar17->field_0x1 +
                  (((*(byte *)pCVar17 >> 5 & 1) != 0) + 1 & (uint)(*(byte *)pCVar17 >> 7) * 3);
          goto LAB_0021adc3;
        }
        iVar7 = count_quotes((utf8_ptr *)pCVar17,qu);
        pbVar16 = local_78;
        if (2 < iVar7) {
          uVar10.p_ = local_88.p_;
          if (iVar7 == 3) {
            pbVar15 = (byte *)p->p_;
          }
          else {
            uVar20 = iVar7 + 1;
            do {
              sVar9 = utf8_ptr::s_putch(uVar10.p_,qu);
              uVar10.p_ = uVar10.p_ + sVar9;
              pbVar15 = (byte *)p->p_;
              uVar19 = (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3);
              p->p_ = (char *)(pbVar15 + uVar19 + 1);
              uVar20 = uVar20 - 1;
            } while (4 < uVar20);
            pbVar15 = pbVar15 + uVar19 + 1;
          }
          lVar11 = -3;
          do {
            pbVar15 = pbVar15 + (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3)
                                + 1;
            p->p_ = (char *)pbVar15;
            lVar11 = lVar11 + 1;
            local_78 = pbVar16;
            local_88.p_ = uVar10.p_;
          } while (lVar11 != 0);
          goto LAB_0021adc3;
        }
      }
      pCVar18 = local_70;
      if (wVar6 != L'\\') break;
      xlat_escape(pCVar17,&local_88,p,qu,iVar5);
    }
    if (wVar6 == L'\0') {
      sVar9 = (long)local_88.p_ - (long)local_78;
      tok->text_ = (char *)local_78;
      tok->text_len_ = sVar9;
      *local_88.p_ = 0;
      if (0 < (long)sVar9) {
        uVar19 = 0;
        pbVar16 = local_78;
        do {
          pbVar16 = pbVar16 + (ulong)(((*pbVar16 >> 5 & 1) != 0) + 1 & (uint)(*pbVar16 >> 7) * 3) +
                              1;
          uVar19 = uVar19 + 1;
        } while (pbVar16 < local_88.p_);
        if (0x14 < uVar19) {
          lVar11 = -0x14;
          pbVar16 = local_78;
          do {
            pbVar16 = pbVar16 + (ulong)(((*pbVar16 >> 5 & 1) != 0) + 1 & (uint)(*pbVar16 >> 7) * 3)
                                + 1;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0);
          sVar9 = (long)pbVar16 - (long)local_78;
        }
      }
      if (((qu == L'\"') && (tok->text_len_ == 0)) &&
         (sVar2 = (local_70->unsplicebuf_).buf_len_, sVar2 != 0)) {
        CTcTokString::ensure_space(&local_70->unsplicebuf_,sVar2 + 2);
        pcVar3 = (pCVar18->unsplicebuf_).buf_;
        memmove(pcVar3 + 1,pcVar3,(pCVar18->unsplicebuf_).buf_len_);
        uVar19 = (pCVar18->unsplicebuf_).buf_len_ + 1;
        (pCVar18->unsplicebuf_).buf_len_ = uVar19;
        if (uVar19 < (pCVar18->unsplicebuf_).buf_size_) {
          (pCVar18->unsplicebuf_).buf_[uVar19] = '\0';
        }
        *pcVar3 = '\"';
        return TOKT_NULLTOK;
      }
      log_error(0x2b11,(ulong)(uint)(int)(char)qu,sVar9,local_78,(ulong)(uint)(int)(char)qu);
      return tok->typ_;
    }
    if (((local_80 != (tok_embed_ctx *)0x0) && (wVar6 == L'<')) &&
       ((tok->typ_ != TOKT_RESTR && (wVar8 = utf8_ptr::s_getch_at(p->p_,1), wVar8 == L'<')))) break;
    uVar10.p_ = local_88.p_;
    sVar9 = utf8_ptr::s_putch(local_88.p_,wVar6);
    local_88.p_ = uVar10.p_ + sVar9;
    bVar1 = *p->p_;
    p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
  }
  tVar4 = tok->typ_;
  if (tVar4 == TOKT_SSTR) {
    tVar13 = TOKT_SSTR_START;
  }
  else if (tVar4 == TOKT_DSTR) {
    tVar13 = TOKT_DSTR_START;
  }
  else if (tVar4 == TOKT_DSTR_END) {
    tVar13 = TOKT_DSTR_MID;
  }
  else {
    tVar13 = TOKT_SSTR_MID;
    if (tVar4 != TOKT_SSTR_END) {
      tVar13 = tVar4;
    }
  }
  tok->typ_ = tVar13;
  pbVar16 = (byte *)p->p_;
  lVar11 = -2;
  do {
    pbVar16 = pbVar16 + (ulong)(((*pbVar16 >> 5 & 1) != 0) + 1 & (uint)(*pbVar16 >> 7) * 3) + 1;
    p->p_ = (char *)pbVar16;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0);
  wVar6 = utf8_ptr::s_getch((char *)pbVar16);
  pCVar17 = local_70;
  if (wVar6 == L'%') {
    pcVar3 = p->p_;
    pCVar18 = local_70;
    local_68.p_ = pcVar3;
    scan_sprintf_spec(local_70,p);
    local_60.p_ = pcVar3;
    xlat_escapes(pCVar18,&local_60,&local_68,p);
    local_58.text_len_ = (long)local_60.p_ - (long)pcVar3;
    local_58.typ_ = TOKT_FMTSPEC;
    local_58.text_ = pcVar3;
    push(pCVar17,&local_58);
  }
  tok_embed_ctx::start_expr(local_80,qu,iVar5,1);
LAB_0021adc3:
  tok->text_ = (char *)local_78;
  tok->text_len_ = (long)local_88.p_ - (long)local_78;
  *local_88.p_ = 0;
  return tok->typ_;
}

Assistant:

tc_toktyp_t CTcTokenizer::xlat_string_to(
    char *dstp, utf8_ptr *p, CTcToken *tok, tok_embed_ctx *ec,
    int force_embed_end)
{
    /* set up our output utf8 pointer */
    utf8_ptr dst(dstp);

    /* note the open quote character */
    wchar_t qu = p->getch();

    /* set the appropriate string token type */
    tok->settyp(qu == '"' ? TOKT_DSTR :
                qu == '\'' ? TOKT_SSTR :
                qu == 'R' ? TOKT_RESTR :
                ec != 0 ? ec->endtok() :
                TOKT_INVALID);

    /* if it's a regex string, skip the 'R' and note the actual quote type */
    if (qu == 'R')
    {
        p->inc();
        qu = p->getch();
    }

    /* 
     *   If we're at a quote (rather than at '>>' for continuing from an
     *   embedded expression), count consecutive open quotes, to determine if
     *   we're in a triple-quoted string.  
     */
    int triple = FALSE;
    if (qu == '"' || qu == '\'')
    {
        /* count the consecutive open quotes */
        if (count_quotes(p, qu) >= 3)
        {
            /* skip past the additional two open quotes */
            p->inc();
            p->inc();

            /* note that we're in a triple-quoted string */
            triple = TRUE;
        }
    }

    /* skip the open quote */
    p->inc();

    /* check for the end of an embedded expression (forced or actual) */
    if (force_embed_end)
    {
        /* 
         *   they want us to assume the embedding ends here, regardless of
         *   what we're looking at - act the same as though we had
         *   actually seen '>>', but don't skip any input (in fact, back
         *   up one, since we already skipped one character for what we
         *   had thought was the open quote 
         */
        p->dec();

        /* restore the enclosing string context */
        qu = ec->qu();
        triple = ec->triple();
        tok->settyp(ec->endtok());

        /* clear the caller's in-embedding status */
        ec->end_expr();
    }
    else if (qu == '>' && ec->parens() == 0)
    {
        /* skip the second '>' */
        p->inc();

        /* restore the enclosing string context */
        qu = ec->qu();
        triple = ec->triple();

        /* end the expression */
        ec->end_expr();
    }

    /* scan the string and translate quotes */
    for (;;)
    {
        /* get this character */
        wchar_t cur = p->getch();

        /* if this is the matching quote, we're done */
        if (cur == qu)
        {
            /* 
             *   If we're in a triple-quote string, count consecutive quotes.
             *   Triple quotes are greedy: if we have N>3 quotes in a row,
             *   the first N-3 are inside the string, and the last 3 are the
             *   terminating quotes. 
             */
            if (triple)
            {
                /* we need at least three quotes to end the string */
                int qcnt = count_quotes(p, qu);
                if (qcnt >= 3)
                {
                    /* copy all but the last three quotes to the output */
                    for ( ; qcnt > 3 ; --qcnt, p->inc())
                        dst.setch(qu);

                    /* skip the three quotes */
                    p->inc_by(3);

                    /* done with the string */
                    break;
                }
            }
            else
            {
                /* 
                 *   It's an ordinary string, which ends with just one
                 *   matching quote, so we're done no matter what follows.
                 *   Skip the quote and stop scanning.
                 */
                p->inc();
                break;
            }
        }

        /* 
         *   if we find an end-of-line within the string, it's an error -
         *   we should always splice strings together onto a single line
         *   before starting to tokenize the line 
         */
        if (cur == '\0')
        {
            /* set the token's text pointer */
            size_t bytelen = dst.getptr() - dstp;
            tok->set_text(dstp, bytelen);

            /* null-terminate the result string */
            dst.setch('\0');

            /* 
             *   get the length of the unterminated string so far, but for
             *   error logging, limit the length to twenty characters --
             *   we just want to give the user enough information to find
             *   the string in error, without making the error message
             *   huge 
             */
            utf8_ptr dp(dstp);
            size_t charlen = dp.len(bytelen);
            if (charlen > 20)
                bytelen = dp.bytelen(20);

            /*
             *   Check for a special heuristic case.  If the string was of
             *   zero length, and we have something sitting in our
             *   unsplice buffer, here's what probably happened: the input
             *   was missing a ">>" sequence at the end of an embedded
             *   expression, and the parser told us to put it back in.  We
             *   had earlier decided we needed to splice up to a quote to
             *   end what looked to us like an unterminated string.  If
             *   this is the case, we and the parser are working at cross
             *   purposes; the parser is smarter than we are, so we should
             *   synchronize with it.  
             */
            if (tok->get_text_len() == 0
                && qu == '"'
                && unsplicebuf_.get_text_len() != 0)
            {
                /* 
                 *   we must have spliced a line to finish a string -
                 *   insert the quote into the splice buffer, and ignore
                 *   it here 
                 */

                /* 
                 *   make sure there's room for one more character (plus a
                 *   null byte) 
                 */
                unsplicebuf_.ensure_space(unsplicebuf_.get_text_len() + 2);

                /* get the buffer pointer */
                char *buf = unsplicebuf_.get_buf();

                /* make room for the '"' */
                memmove(buf + 1, buf, unsplicebuf_.get_text_len());
                unsplicebuf_.set_text_len(unsplicebuf_.get_text_len() + 1);

                /* add the '"' */
                *buf = '"';

                /* 
                 *   return the 'null token' to tell the caller to try
                 *   again - do not log an error at this point 
                 */
                return TOKT_NULLTOK;
            }

            /* log the error */
            log_error(TCERR_UNTERM_STRING,
                      (char)qu, (int)bytelen, dstp, (char)qu);

            /* return the string type */
            return tok->gettyp();
        }

        /* if this is an escape, translate it */
        if (cur == '\\')
        {
            /* translate the escape */
            xlat_escape(&dst, p, qu, triple);
            continue;
        }
        else if (ec != 0
                 && tok->gettyp() != TOKT_RESTR
                 && cur == '<' && p->getch_at(1) == '<')
        {
            /* 
             *   It's the start of an embedded expression - change the type
             *   to so indicate.  If we think we have a regular SSTR or DSTR,
             *   switch to the appropriate START type, since the part up to
             *   here is actually the starting fragment of a string with an
             *   embedded expression.  If we think we're in an END section,
             *   switch to the corresponding MID section, since we're parsing
             *   a fragment that already followed an embedding.  The only
             *   other possibility is that we're in a MID section, in which
             *   case just stay in the same MID section.  
             */
            tc_toktyp_t tt = tok->gettyp();
            tok->settyp(tt == TOKT_DSTR ? TOKT_DSTR_START :
                        tt == TOKT_DSTR_END ? TOKT_DSTR_MID :
                        tt == TOKT_SSTR ? TOKT_SSTR_START :
                        tt == TOKT_SSTR_END ? TOKT_SSTR_MID :
                        tt);

            /* skip the << */
            p->inc_by(2);

            /*
             *   Check for a '%' sprintf-style formatting sequence.  If we
             *   have a '%' immediately after the second '<', it's a sprintf
             *   format code. 
             */
            if (p->getch() == '%')
            {
                /* remember the starting point of the format string */
                utf8_ptr fmt(p);

                /* scan the format spec */
                scan_sprintf_spec(p);

                /* translate escapes */
                utf8_ptr dst(&fmt);
                xlat_escapes(&dst, &fmt, p);

                /* push the format spec into the token stream */
                CTcToken ftok;
                ftok.set_text(fmt.getptr(), dst.getptr() - fmt.getptr());
                ftok.settyp(TOKT_FMTSPEC);
                push(&ftok);
            }

            /* tell the caller we're in an embedding */
            ec->start_expr(qu, triple, TRUE);

            /* stop scanning */
            break;
        }

        /* copy this character to the output position */
        dst.setch(cur);

        /* get the next character */
        p->inc();
    }

    /* set the token's text pointer */
    tok->set_text(dstp, dst.getptr() - dstp);

    /* null-terminate the result string */
    dst.setch('\0');

    /* return the string type */
    return tok->gettyp();
}